

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O0

bool __thiscall cmProcess::Buffer::GetLine(Buffer *this,string *line)

{
  reference pvVar1;
  char *pcVar2;
  size_type sVar3;
  bool bVar4;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_60;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_58;
  const_iterator local_50;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_48;
  const_iterator local_40;
  long local_38;
  size_type length;
  char *text;
  size_type sz;
  string *line_local;
  Buffer *this_local;
  
  sz = (size_type)line;
  line_local = (string *)this;
  text = (char *)std::vector<char,_std::allocator<char>_>::size
                           (&this->super_vector<char,_std::allocator<char>_>);
  while( true ) {
    if ((char *)this->Last == text) {
      if (this->First != 0) {
        local_48._M_current =
             (char *)std::vector<char,_std::allocator<char>_>::begin
                               (&this->super_vector<char,_std::allocator<char>_>);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_40,&local_48);
        local_60._M_current =
             (char *)std::vector<char,_std::allocator<char>_>::begin
                               (&this->super_vector<char,_std::allocator<char>_>);
        local_58 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator+(&local_60,this->First);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_50,&local_58);
        std::vector<char,_std::allocator<char>_>::erase
                  (&this->super_vector<char,_std::allocator<char>_>,local_40,local_50);
        this->First = 0;
        sVar3 = std::vector<char,_std::allocator<char>_>::size
                          (&this->super_vector<char,_std::allocator<char>_>);
        this->Last = sVar3;
      }
      return false;
    }
    pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                       (&this->super_vector<char,_std::allocator<char>_>,this->Last);
    if ((*pvVar1 == '\n') ||
       (pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                           (&this->super_vector<char,_std::allocator<char>_>,this->Last),
       *pvVar1 == '\0')) break;
    this->Last = this->Last + 1;
  }
  pcVar2 = std::vector<char,_std::allocator<char>_>::data
                     (&this->super_vector<char,_std::allocator<char>_>);
  length = (size_type)(pcVar2 + this->First);
  local_38 = this->Last - this->First;
  while( true ) {
    bVar4 = false;
    if (local_38 != 0) {
      bVar4 = *(char *)(length + local_38 + -1) == '\r';
    }
    if (!bVar4) break;
    local_38 = local_38 + -1;
  }
  std::__cxx11::string::assign((char *)sz,length);
  this->Last = this->Last + 1;
  this->First = this->Last;
  return true;
}

Assistant:

bool cmProcess::Buffer::GetLine(std::string& line)
{
  // Scan for the next newline.
  for (size_type sz = this->size(); this->Last != sz; ++this->Last) {
    if ((*this)[this->Last] == '\n' || (*this)[this->Last] == '\0') {
      // Extract the range first..last as a line.
      const char* text = this->data() + this->First;
      size_type length = this->Last - this->First;
      while (length && text[length - 1] == '\r') {
        length--;
      }
      line.assign(text, length);

      // Start a new range for the next line.
      ++this->Last;
      this->First = Last;

      // Return the line extracted.
      return true;
    }
  }

  // Available data have been exhausted without a newline.
  if (this->First != 0) {
    // Move the partial line to the beginning of the buffer.
    this->erase(this->begin(), this->begin() + this->First);
    this->First = 0;
    this->Last = this->size();
  }
  return false;
}